

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O0

int w_mtx_lock(pthread_mutex_t *mtx)

{
  int error;
  pthread_mutex_t *mtx_local;
  
  if (mtx == (pthread_mutex_t *)0x0) {
    w_abort(-1);
  }
  mtx_local._4_4_ = pthread_mutex_lock((pthread_mutex_t *)mtx);
  if (mtx_local._4_4_ == 0) {
    mtx_local._4_4_ = 0;
  }
  return mtx_local._4_4_;
}

Assistant:

int
w_mtx_lock(
    pthread_mutex_t *mtx
)
{
    int error;

    WP_PLATFORM_ASSERT(mtx != NULL);

    error = pthread_mutex_lock(mtx);
    if (error != 0)
    {
        return error;
    }

    return 0;
}